

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

void cleanup_lore(void)

{
  monster_friends *pmVar1;
  monster_friends_base *pmVar2;
  monster_mimic *pmVar3;
  monster_drop *pmVar4;
  monster_lore *pmVar5;
  monster_mimic *mn;
  monster_friends_base *fbn;
  monster_friends *fn;
  monster_drop *dn;
  monster_mimic *m;
  monster_friends_base *fb;
  monster_friends *f;
  monster_drop *d;
  monster_lore *l;
  wchar_t ridx;
  
  for (l._4_4_ = 0; pmVar5 = l_list, l._4_4_ < (int)(uint)z_info->r_max; l._4_4_ = l._4_4_ + 1) {
    f = (monster_friends *)l_list[l._4_4_].drops;
    while (f != (monster_friends *)0x0) {
      pmVar1 = f->next;
      mem_free(f);
      f = pmVar1;
    }
    fb = (monster_friends_base *)pmVar5[l._4_4_].friends;
    while (fb != (monster_friends_base *)0x0) {
      pmVar2 = fb->next;
      mem_free(fb);
      fb = pmVar2;
    }
    m = (monster_mimic *)pmVar5[l._4_4_].friends_base;
    while (m != (monster_mimic *)0x0) {
      pmVar3 = m->next;
      mem_free(m);
      m = pmVar3;
    }
    dn = (monster_drop *)pmVar5[l._4_4_].mimic_kinds;
    while (dn != (monster_drop *)0x0) {
      pmVar4 = dn->next;
      mem_free(dn);
      dn = pmVar4;
    }
    mem_free(pmVar5[l._4_4_].blows);
    mem_free(pmVar5[l._4_4_].blow_known);
  }
  mem_free(l_list);
  return;
}

Assistant:

static void cleanup_lore(void)
{
	int ridx;

	for (ridx = 0; ridx < z_info->r_max; ridx++) {
		struct monster_lore *l = &l_list[ridx];
		struct monster_drop *d;
		struct monster_friends *f;
		struct monster_friends_base *fb;
		struct monster_mimic *m;

		d = l->drops;
		while (d) {
			struct monster_drop *dn = d->next;
			mem_free(d);
			d = dn;
		}
		f = l->friends;
		while (f) {
			struct monster_friends *fn = f->next;
			mem_free(f);
			f = fn;
		}
		fb = l->friends_base;
		while (fb) {
			struct monster_friends_base *fbn = fb->next;
			mem_free(fb);
			fb = fbn;
		}
		m = l->mimic_kinds;
		while (m) {
			struct monster_mimic *mn = m->next;
			mem_free(m);
			m = mn;
		}
		mem_free(l->blows);
		mem_free(l->blow_known);
	}

	mem_free(l_list);
}